

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonOneofFieldVariables
          (FieldGeneratorBase *this,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  anon_union_8_1_a8a14541_for_iterator_2 aVar1;
  undefined8 uVar2;
  char cVar3;
  FieldDescriptor *descriptor;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *descriptor_01;
  FieldDescriptor *extraout_RDX_05;
  anon_union_8_1_a8a14541_for_iterator_2 local_110;
  ctrl_t *local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [32];
  string local_d0;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_b0 [2];
  undefined1 local_80 [24];
  char *local_68;
  ctrl_t *local_60;
  anon_union_8_1_a8a14541_for_iterator_2 local_58;
  undefined8 local_50;
  char *local_48;
  size_type local_40;
  pointer local_38;
  
  oneof_name_abi_cxx11_((string *)local_80,this);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>(local_b0,variables,(char (*) [11])0x3f5c89);
  std::__cxx11::string::operator=
            ((string *)((long)local_b0[0].first.field_1.slot_ + 0x10),(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((this->descriptor_[2] == (FieldDescriptor)0xb) ||
     (cVar3 = google::protobuf::FieldDescriptor::has_presence(), cVar3 == '\0')) {
    oneof_name_abi_cxx11_((string *)local_f0,this);
    uVar2 = local_f0._0_8_;
    oneof_property_name_abi_cxx11_((string *)&local_110,this);
    aVar1 = local_110;
    GetOneofCaseName_abi_cxx11_(&local_d0,(csharp *)this->descriptor_,descriptor_00);
    local_80._0_8_ = local_f0._8_8_;
    local_80._8_8_ = uVar2;
    local_80._16_8_ = 9;
    local_68 = "Case_ == ";
    local_60 = local_108;
    local_58 = aVar1;
    local_50 = 10;
    local_48 = "OneofCase.";
    local_40 = local_d0._M_string_length;
    local_38 = local_d0._M_dataplus._M_p;
    absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_b0,local_80,5);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[19]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_80,variables,(char (*) [19])0x400ac4);
    std::__cxx11::string::operator=((string *)(local_80._8_8_ + 0x10),(string *)local_b0);
    descriptor_01 = extraout_RDX_01;
    if ((bool *)local_b0[0].first.ctrl_ != &local_b0[0].second) {
      operator_delete(local_b0[0].first.ctrl_,local_b0[0]._16_8_ + 1);
      descriptor_01 = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      descriptor_01 = extraout_RDX_03;
    }
    if (local_110.slot_ != (slot_type *)local_100) {
      operator_delete(local_110.slot_,local_100._0_8_ + 1);
      descriptor_01 = extraout_RDX_04;
    }
    if ((undefined1 *)local_f0._0_8_ == local_f0 + 0x10) goto LAB_0023af91;
  }
  else {
    local_80._0_8_ = (pointer)0x3;
    local_80._8_8_ = "Has";
    GetPropertyName_abi_cxx11_((string *)&local_110,(csharp *)this->descriptor_,descriptor);
    local_b0[0].first.ctrl_ = local_108;
    local_b0[0].first.field_1.slot_ = (slot_type *)local_110;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_f0,(AlphaNum *)local_80);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[19]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_d0,variables,(char (*) [19])0x400ac4);
    std::__cxx11::string::operator=((string *)(local_d0._M_string_length + 0x10),(string *)local_f0)
    ;
    descriptor_01 = extraout_RDX;
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      descriptor_01 = extraout_RDX_00;
    }
    local_f0._16_8_ = local_100._0_8_;
    local_f0._0_8_ = local_110;
    if (local_110.slot_ == (slot_type *)local_100) goto LAB_0023af91;
  }
  operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  descriptor_01 = extraout_RDX_05;
LAB_0023af91:
  GetOneofCaseName_abi_cxx11_((string *)local_80,(csharp *)this->descriptor_,descriptor_01);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[16]>(local_b0,variables,(char (*) [16])"oneof_case_name");
  std::__cxx11::string::operator=
            ((string *)((long)local_b0[0].first.field_1.slot_ + 0x10),(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  oneof_property_name_abi_cxx11_((string *)local_80,this);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[20]>(local_b0,variables,(char (*) [20])"oneof_property_name");
  std::__cxx11::string::operator=
            ((string *)((long)local_b0[0].first.field_1.slot_ + 0x10),(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonOneofFieldVariables(
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["oneof_name"] = oneof_name();
  if (SupportsPresenceApi(descriptor_)) {
    (*variables)["has_property_check"] = absl::StrCat("Has", property_name());
  } else {
    (*variables)["has_property_check"] =
        absl::StrCat(oneof_name(), "Case_ == ", oneof_property_name(),
                     "OneofCase.", oneof_case_name());
  }
  (*variables)["oneof_case_name"] = oneof_case_name();
  (*variables)["oneof_property_name"] = oneof_property_name();
}